

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnGlobalGetExpr
          (BinaryReaderInterp *this,Index global_index)

{
  State *pSVar1;
  pointer pGVar2;
  ulong uVar3;
  Result RVar4;
  Enum EVar5;
  uint uVar6;
  ulong uVar7;
  Enum op;
  char *pcVar8;
  Location loc_1;
  Location loc;
  Location LStack_170;
  Location LStack_150;
  Var VStack_130;
  ulong uStack_e8;
  Location *pLStack_e0;
  Var *pVStack_d8;
  BinaryReaderInterp *pBStack_d0;
  SharedValidator *pSStack_c8;
  ulong uStack_c0;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  uVar3 = (ulong)global_index;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  uStack_c0 = 0x11f911;
  Var::Var(&local_78,global_index,&local_b8);
  uStack_c0 = 0x11f91f;
  RVar4 = SharedValidator::OnGlobalGet(&this->validator_,&local_98,&local_78);
  uStack_c0 = 0x11f929;
  Var::~Var(&local_78);
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
    pGVar2 = (this->global_types_).
             super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->global_types_).
                   super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar2 >> 3) *
            -0x5555555555555555;
    if (uVar7 < uVar3 || uVar7 - uVar3 == 0) {
      pcVar8 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
      uStack_c0 = 0x11f9ab;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      LStack_150.field_1.field_0.last_column = 0;
      LStack_150.filename._M_len = *(size_t *)(pcVar8 + 0x3a0);
      LStack_150.filename._M_str = *(char **)(pcVar8 + 0x3a8);
      LStack_150.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           *(size_t *)(*(long *)(pcVar8 + 8) + 0x10);
      LStack_170.field_1.field_0.last_column = 0;
      LStack_170.filename._M_len = *(size_t *)(pcVar8 + 0x3a0);
      LStack_170.filename._M_str = *(char **)(pcVar8 + 0x3a8);
      LStack_170.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           *(size_t *)(*(long *)(pcVar8 + 8) + 0x10);
      uStack_e8 = uVar3;
      pLStack_e0 = &local_98;
      pVStack_d8 = &local_78;
      pBStack_d0 = this;
      pSStack_c8 = &this->validator_;
      uStack_c0 = (ulong)RVar4.enum_;
      Var::Var(&VStack_130,global_index,&LStack_170);
      RVar4 = SharedValidator::OnGlobalSet
                        ((SharedValidator *)(pcVar8 + 0x28),&LStack_150,&VStack_130);
      Var::~Var(&VStack_130);
      if (RVar4.enum_ != Error) {
        Istream::Emit(*(Istream **)(pcVar8 + 0x20),GlobalSet,global_index);
      }
      return (Result)(uint)(RVar4.enum_ == Error);
    }
    uVar6 = *(int *)&pGVar2[uVar3].super_ExternType.field_0xc + 0x17;
    op = GlobalGet;
    if (uVar6 < 8) {
      op = *(Enum *)(&DAT_0015dbb0 + (ulong)uVar6 * 4);
    }
    uStack_c0 = 0x11f989;
    Istream::Emit(this->istream_,op,global_index);
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderInterp::OnGlobalGetExpr(Index global_index) {
  CHECK_RESULT(
      validator_.OnGlobalGet(GetLocation(), Var(global_index, GetLocation())));

  Type type = global_types_.at(global_index).type;
  if (type.IsRef()) {
    istream_.Emit(Opcode::InterpGlobalGetRef, global_index);
  } else {
    istream_.Emit(Opcode::GlobalGet, global_index);
  }
  return Result::Ok;
}